

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O0

void callhook(lua_State *L,int event,BCLine line)

{
  code *pcVar1;
  ulong uVar2;
  long in_RDI;
  lua_Debug ar;
  lua_Hook hookf;
  global_State *g;
  undefined1 local_a8 [4];
  MSize in_stack_ffffffffffffff5c;
  lua_State *in_stack_ffffffffffffff60;
  
  uVar2 = (ulong)*(uint *)(in_RDI + 8);
  pcVar1 = *(code **)(uVar2 + 0xd0);
  if ((pcVar1 != (code *)0x0) && ((*(byte *)(uVar2 + 0x91) & 0x10) == 0)) {
    *(uint *)(uVar2 + 0x254) = *(uint *)(uVar2 + 0x254) & 0xffffffef;
    if ((long)((ulong)*(uint *)(in_RDI + 0x20) - *(long *)(in_RDI + 0x18)) < 0xa9) {
      lj_state_growstack(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    }
    *(byte *)(uVar2 + 0x91) = *(byte *)(uVar2 + 0x91) | 0x10;
    (*pcVar1)(in_RDI,local_a8);
    *(byte *)(uVar2 + 0x91) = *(byte *)(uVar2 + 0x91) & 0xef;
  }
  return;
}

Assistant:

static void callhook(lua_State *L, int event, BCLine line)
{
  global_State *g = G(L);
  lua_Hook hookf = g->hookf;
  if (hookf && !hook_active(g)) {
    lua_Debug ar;
    lj_trace_abort(g);  /* Abort recording on any hook call. */
    ar.event = event;
    ar.currentline = line;
    /* Top frame, nextframe = NULL. */
    ar.i_ci = (int)((L->base-1) - tvref(L->stack));
    lj_state_checkstack(L, 1+LUA_MINSTACK);
    hook_enter(g);
    hookf(L, &ar);
    lua_assert(hook_active(g));
    hook_leave(g);
  }
}